

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  REF_CELL pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  void *__ptr;
  REF_DBL *total_node_volume_00;
  double local_1a0;
  double local_190;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_DBL *backup;
  REF_INT nodes [27];
  REF_CELL ref_cell;
  int local_a0;
  REF_INT cell;
  REF_INT im;
  REF_INT node;
  REF_DBL log_m [6];
  REF_DBL m [6];
  REF_DBL *total_node_volume;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x696,
           "ref_metric_imply_non_tet","malloc backup of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)(ref_node_00->max * 6) << 3);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x696,"ref_metric_imply_non_tet","malloc backup of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (cell = 0; cell < ref_node_00->max; cell = cell + 1) {
        if (((-1 < cell) && (cell < ref_node_00->max)) && (-1 < ref_node_00->global[cell])) {
          for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
            *(REF_DBL *)((long)__ptr + (long)(local_a0 + cell * 6) * 8) =
                 metric[local_a0 + cell * 6];
          }
        }
      }
      if (ref_node_00->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x69b,"ref_metric_imply_non_tet","malloc total_node_volume of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        total_node_volume_00 = (REF_DBL *)malloc((long)ref_node_00->max << 3);
        if (total_node_volume_00 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x69b,"ref_metric_imply_non_tet","malloc total_node_volume of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            total_node_volume_00[ref_private_macro_code_rss_1] = 0.0;
          }
          for (cell = 0; cell < ref_node_00->max; cell = cell + 1) {
            if (((-1 < cell) && (cell < ref_node_00->max)) && (-1 < ref_node_00->global[cell])) {
              if ((cell < 0) || (ref_grid->cell[9]->ref_adj->nnode <= cell)) {
                local_170 = -1;
              }
              else {
                local_170 = ref_grid->cell[9]->ref_adj->first[cell];
              }
              if (local_170 == -1) {
                if ((cell < 0) || (ref_grid->cell[10]->ref_adj->nnode <= cell)) {
                  local_174 = -1;
                }
                else {
                  local_174 = ref_grid->cell[10]->ref_adj->first[cell];
                }
                if (local_174 == -1) {
                  if ((cell < 0) || (ref_grid->cell[0xb]->ref_adj->nnode <= cell)) {
                    local_178 = -1;
                  }
                  else {
                    local_178 = ref_grid->cell[0xb]->ref_adj->first[cell];
                  }
                  if (local_178 == -1) goto LAB_00257334;
                }
              }
              for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
                metric[local_a0 + cell * 6] = 0.0;
              }
            }
LAB_00257334:
          }
          pRVar1 = ref_grid->cell[10];
          for (ref_cell._4_4_ = 0; ref_cell._4_4_ < pRVar1->max; ref_cell._4_4_ = ref_cell._4_4_ + 1
              ) {
            RVar2 = ref_cell_nodes(pRVar1,ref_cell._4_4_,(REF_INT *)&backup);
            if (RVar2 == 0) {
              uVar3 = add_sub_tet(0,4,5,3,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6ae,"ref_metric_imply_non_tet",(ulong)uVar3,"pri sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(0,1,5,4,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6b1,"ref_metric_imply_non_tet",(ulong)uVar3,"pri sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(0,1,2,5,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6b4,"ref_metric_imply_non_tet",(ulong)uVar3,"pri sub tet");
                return uVar3;
              }
            }
          }
          pRVar1 = ref_grid->cell[9];
          for (ref_cell._4_4_ = 0; ref_cell._4_4_ < pRVar1->max; ref_cell._4_4_ = ref_cell._4_4_ + 1
              ) {
            RVar2 = ref_cell_nodes(pRVar1,ref_cell._4_4_,(REF_INT *)&backup);
            if (RVar2 == 0) {
              uVar3 = add_sub_tet(0,4,1,2,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6bb,"ref_metric_imply_non_tet",(ulong)uVar3,"pyr sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(0,3,4,2,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6be,"ref_metric_imply_non_tet",(ulong)uVar3,"pyr sub tet");
                return uVar3;
              }
            }
          }
          pRVar1 = ref_grid->cell[0xb];
          for (ref_cell._4_4_ = 0; ref_cell._4_4_ < pRVar1->max; ref_cell._4_4_ = ref_cell._4_4_ + 1
              ) {
            RVar2 = ref_cell_nodes(pRVar1,ref_cell._4_4_,(REF_INT *)&backup);
            if (RVar2 == 0) {
              uVar3 = add_sub_tet(0,5,7,4,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6ca,"ref_metric_imply_non_tet",(ulong)uVar3,"hex sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(0,1,7,5,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6cd,"ref_metric_imply_non_tet",(ulong)uVar3,"hex sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(1,6,7,5,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6d0,"ref_metric_imply_non_tet",(ulong)uVar3,"hex sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(0,7,2,3,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6d4,"ref_metric_imply_non_tet",(ulong)uVar3,"hex sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(0,7,1,2,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6d7,"ref_metric_imply_non_tet",(ulong)uVar3,"hex sub tet");
                return uVar3;
              }
              uVar3 = add_sub_tet(1,7,6,2,(REF_INT *)&backup,metric,total_node_volume_00,ref_node_00
                                  ,pRVar1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6da,"ref_metric_imply_non_tet",(ulong)uVar3,"hex sub tet");
                return uVar3;
              }
            }
          }
          for (cell = 0; cell < ref_node_00->max; cell = cell + 1) {
            if (((-1 < cell) && (cell < ref_node_00->max)) && (-1 < ref_node_00->global[cell])) {
              if ((cell < 0) || (ref_grid->cell[9]->ref_adj->nnode <= cell)) {
                local_17c = -1;
              }
              else {
                local_17c = ref_grid->cell[9]->ref_adj->first[cell];
              }
              if (local_17c == -1) {
                if ((cell < 0) || (ref_grid->cell[10]->ref_adj->nnode <= cell)) {
                  local_180 = -1;
                }
                else {
                  local_180 = ref_grid->cell[10]->ref_adj->first[cell];
                }
                if (local_180 == -1) {
                  if ((cell < 0) || (ref_grid->cell[0xb]->ref_adj->nnode <= cell)) {
                    local_184 = -1;
                  }
                  else {
                    local_184 = ref_grid->cell[0xb]->ref_adj->first[cell];
                  }
                  if (local_184 == -1) {
                    for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
                      if (0x7fefffffffffffff < (ulong)ABS(metric[local_a0 + cell * 6])) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x6fa,"ref_metric_imply_non_tet","orig,tet not finite");
                        return 1;
                      }
                    }
                    goto LAB_00258130;
                  }
                }
              }
              if (ref_node_00->ref_mpi->id == ref_node_00->part[cell]) {
                if (total_node_volume_00[cell] <= 0.0) {
                  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
                    metric[local_a0 + cell * 6] =
                         *(REF_DBL *)((long)__ptr + (long)(local_a0 + cell * 6) * 8);
                  }
                  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
                    if (0x7fefffffffffffff < (ulong)ABS(metric[local_a0 + cell * 6])) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x6f5,"ref_metric_imply_non_tet","backup not finite");
                      return 1;
                    }
                  }
                }
                else {
                  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
                    if (total_node_volume_00[cell] * 1e+20 <= 0.0) {
                      local_190 = -(total_node_volume_00[cell] * 1e+20);
                    }
                    else {
                      local_190 = total_node_volume_00[cell] * 1e+20;
                    }
                    if (metric[local_a0 + cell * 6] <= 0.0) {
                      local_1a0 = -metric[local_a0 + cell * 6];
                    }
                    else {
                      local_1a0 = metric[local_a0 + cell * 6];
                    }
                    if (local_190 <= local_1a0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x6e9,"ref_metric_imply_non_tet",4,"zero volume");
                      return 4;
                    }
                    *(double *)(&im + (long)local_a0 * 2) =
                         metric[local_a0 + cell * 6] / total_node_volume_00[cell];
                  }
                  uVar3 = ref_matrix_exp_m((REF_DBL *)&im,log_m + 5);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x6ec,"ref_metric_imply_non_tet",(ulong)uVar3,"exp");
                    return uVar3;
                  }
                  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
                    metric[local_a0 + cell * 6] = log_m[(long)local_a0 + 5];
                  }
                  total_node_volume_00[cell] = 0.0;
                  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
                    if (0x7fefffffffffffff < (ulong)ABS(metric[local_a0 + cell * 6])) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x6f0,"ref_metric_imply_non_tet","infer not finite");
                      return 1;
                    }
                  }
                }
              }
            }
LAB_00258130:
          }
          if (total_node_volume_00 != (REF_DBL *)0x0) {
            free(total_node_volume_00);
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          metric_local._4_4_ = ref_node_ghost_dbl(ref_node_00,metric,6);
          if (metric_local._4_4_ == 0) {
            metric_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x701,"ref_metric_imply_non_tet",(ulong)metric_local._4_4_,"update ghosts");
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,
                                            REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *total_node_volume;
  REF_DBL m[6], log_m[6];
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *backup;

  ref_malloc(backup, 6 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (im = 0; im < 6; im++) backup[im + 6 * node] = metric[im + 6 * node];
  }

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      for (im = 0; im < 6; im++) {
        metric[im + 6 * node] = 0.0;
      }
    }
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  /*
VI1 VI6 VI8 VI5  VI1 VI2 VI8 VI6  VI2 VI7 VI8 VI6
VI1 VI8 VI3 VI4  VI1 VI8 VI2 VI3  VI2 VI8 VI7 VI3
  */

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      if (ref_node_owned(ref_node, node)) {
        if (0.0 < total_node_volume[node]) {
          for (im = 0; im < 6; im++) {
            if (!ref_math_divisible(metric[im + 6 * node],
                                    total_node_volume[node]))
              RSS(REF_DIV_ZERO, "zero volume");
            log_m[im] = metric[im + 6 * node] / total_node_volume[node];
          }
          RSS(ref_matrix_exp_m(log_m, m), "exp");
          for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
          total_node_volume[node] = 0.0;
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "infer not finite");
        } else {
          for (im = 0; im < 6; im++)
            metric[im + 6 * node] = backup[im + 6 * node];
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "backup not finite");
        }
      }
    } else {
      for (im = 0; im < 6; im++)
        RAS(isfinite(metric[im + 6 * node]), "orig,tet not finite");
    }
  }

  ref_free(total_node_volume);
  ref_free(backup);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}